

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::AddItem(Character *this,short item,int amount)

{
  list<Character_Item,_std::allocator<Character_Item>_> *this_00;
  EIF *pEVar1;
  World *pWVar2;
  int iVar3;
  mapped_type *this_01;
  int iVar4;
  _List_node_base *p_Var5;
  allocator<char> local_41;
  Character_Item newitem;
  
  if ((0 < item && 0 < amount) &&
     (pEVar1 = this->world->eif,
     (ulong)(ushort)item <
     (ulong)(((long)(pEVar1->data).
                    super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar1->data).
                   super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x70))) {
    this_00 = &this->inventory;
    p_Var5 = (_List_node_base *)this_00;
    do {
      p_Var5 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)&p_Var5->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)this_00) {
        newitem.id = item;
        newitem.amount = amount;
        std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::push_back
                  (this_00,&newitem);
        goto LAB_00110b56;
      }
    } while (*(short *)&p_Var5[1]._M_next != item);
    iVar4 = amount + *(int *)((long)&p_Var5[1]._M_next + 4);
    if (-1 < iVar4) {
      *(int *)((long)&p_Var5[1]._M_next + 4) = iVar4;
      pWVar2 = this->world;
      std::__cxx11::string::string<std::allocator<char>>((string *)&newitem,"MaxItem",&local_41);
      this_01 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar2->config,(key_type *)&newitem);
      iVar3 = util::variant::GetInt(this_01);
      iVar4 = *(int *)((long)&p_Var5[1]._M_next + 4);
      if (iVar3 < iVar4) {
        iVar4 = iVar3;
      }
      *(int *)((long)&p_Var5[1]._M_next + 4) = iVar4;
      std::__cxx11::string::~string((string *)&newitem);
LAB_00110b56:
      CalculateStats(this,true);
      return true;
    }
  }
  return false;
}

Assistant:

bool Character::AddItem(short item, int amount)
{
	if (amount <= 0)
	{
		return false;
	}

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	UTIL_IFOREACH(this->inventory, it)
	{
		if (it->id == item)
		{
			if (it->amount + amount < 0)
			{
				return false;
			}

			it->amount += amount;

			it->amount = std::min<int>(it->amount, this->world->config["MaxItem"]);

			this->CalculateStats();

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->inventory.push_back(newitem);

	this->CalculateStats();

	return true;
}